

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_trap_flags(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  char *flag_name;
  parser_error pVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"flags");
    pVar5 = PARSE_ERROR_NONE;
    if (_Var1) {
      pcVar4 = parser_getstr(p,"flags");
      pcVar4 = string_make(pcVar4);
      flag_name = strtok(pcVar4," |");
      if (flag_name == (char *)0x0) {
        pVar5 = PARSE_ERROR_NONE;
      }
      else {
        do {
          eVar2 = grab_flag((bitflag *)((long)pvVar3 + 0x68),3,trap_flags,flag_name);
          if (eVar2 != 0) {
            pVar5 = PARSE_ERROR_INVALID_FLAG;
            break;
          }
          pVar5 = PARSE_ERROR_NONE;
          flag_name = strtok((char *)0x0," |");
        } while (flag_name != (char *)0x0);
      }
      string_free(pcVar4);
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_trap_flags(struct parser *p) {
	struct trap_kind *t = parser_priv(p);
	char *flags, *s;

	if (!t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!parser_hasval(p, "flags")) {
		return PARSE_ERROR_NONE;
	}
	flags = string_make(parser_getstr(p, "flags"));
	s = strtok(flags, " |");
	while (s) {
		if (grab_flag(t->flags, TRF_SIZE, trap_flags, s)) {
			break;
		}
		s = strtok(NULL, " |");
	}
	string_free(flags);
	return s ? PARSE_ERROR_INVALID_FLAG : PARSE_ERROR_NONE;
}